

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O0

TestStatus *
vkt::synchronization::anon_unknown_0::singleSubmissionCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkCommandBuffer commandBuffer;
  VkCommandBuffer commandBuffer_00;
  RefData<vk::Handle<(vk::HandleType)6>_> data;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  RefData<vk::Handle<(vk::HandleType)10>_> data_01;
  VkResult result;
  int iVar1;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue pVVar2;
  Handle<(vk::HandleType)24> *pHVar3;
  VkCommandBuffer_s **ppVVar4;
  Handle<(vk::HandleType)10> *pHVar5;
  Handle<(vk::HandleType)6> *pHVar6;
  VkCommandPool *local_348;
  allocator<char> local_281;
  string local_280;
  undefined4 local_260;
  allocator<char> local_259;
  string local_258;
  deUint64 local_238;
  deUint64 local_230;
  Move<vk::Handle<(vk::HandleType)10>_> local_228;
  RefData<vk::Handle<(vk::HandleType)10>_> local_208;
  undefined1 local_1e8 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkSubmitInfo submitInfo;
  VkCommandBuffer cmdBuffers [2];
  undefined1 local_148 [8];
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  RefData<vk::Handle<(vk::HandleType)24>_> local_e8;
  undefined1 local_c8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)6>_> local_98;
  RefData<vk::Handle<(vk::HandleType)6>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  pVVar2 = Context::getUniversalQueue(context);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_ =
       Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence(&local_98,vk_00,device_00,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_78.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_78.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_98);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
             device_00,2,
             fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_e8,
             (Move *)&ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_e8.object.m_internal;
  data_00.deleter.m_device._0_4_ = (int)local_e8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_e8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_c8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_148,vk_00,device_00,
                    (VkCommandPool)pHVar3->m_internal);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)
                    &ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                    vk_00,device_00,(VkCommandPool)pHVar3->m_internal);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_148);
  commandBuffer = *ppVVar4;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)
                       &ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool
                      );
  commandBuffer_00 = *ppVVar4;
  event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x4;
  ::vk::createEvent(&local_228,vk_00,device_00,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_208,(Move *)&local_228);
  data_01.deleter.m_deviceIface = local_208.deleter.m_deviceIface;
  data_01.object.m_internal = local_208.object.m_internal;
  data_01.deleter.m_device._0_4_ = (int)local_208.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_208.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator = local_208.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_1e8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move(&local_228);
  beginCommandBuffer(vk_00,commandBuffer);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_1e8);
  local_230 = pHVar5->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6a])(vk_00,commandBuffer,local_230,1);
  endCommandBuffer(vk_00,commandBuffer);
  beginCommandBuffer(vk_00,commandBuffer_00);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_1e8);
  (*vk_00->_vptr_DeviceInterface[0x6c])(vk_00,commandBuffer_00,1,pHVar5,1,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk_00,commandBuffer_00);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_58);
  local_238 = pHVar6->m_internal;
  result = (*vk_00->_vptr_DeviceInterface[2])
                     (vk_00,pVVar2,1,
                      &event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                       m_allocator,local_238);
  ::vk::checkResult(result,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0xcc);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_58);
  iVar1 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device_00,1,pHVar6,1,0xffffffffffffffff);
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"Wait and set even on device single submission tests pass",
               &local_281);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"Queue should end execution",&local_259);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
  }
  local_260 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_1e8);
  local_348 = &ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
  do {
    local_348 = local_348 + -4;
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
              ((Move<vk::VkCommandBuffer_s_*> *)local_348);
  } while (local_348 != (VkCommandPool *)local_148);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus singleSubmissionCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>			fence				(createFence(vk, device));
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
	VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[SET], *ptrCmdBuffer[WAIT]};
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
															DE_NULL,						// const void*					pNext;
															0u,								// deUint32						waitSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
															DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
															2u,								// deUint32						commandBufferCount;
															cmdBuffers,						// const VkCommandBuffer*		pCommandBuffers;
															0u,								// deUint32						signalSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
														};
	const Unique<VkEvent>			event				(createEvent(vk, device));

	beginCommandBuffer(vk, cmdBuffers[SET]);
	vk.cmdSetEvent(cmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, cmdBuffers[SET]);

	beginCommandBuffer(vk, cmdBuffers[WAIT]);
	vk.cmdWaitEvents(cmdBuffers[WAIT], 1u, &event.get(),VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, cmdBuffers[WAIT]);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device single submission tests pass");
}